

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BufferGLImpl.cpp
# Opt level: O2

void __thiscall Diligent::BufferGLImpl::Unmap(BufferGLImpl *this,GLContextState *CtxState)

{
  GLboolean GVar1;
  string msg;
  
  GLContextState::BindBuffer(CtxState,this->m_BindTarget,&this->m_GlBuffer,true);
  GVar1 = (*__glewUnmapBuffer)(this->m_BindTarget);
  if (GVar1 == '\0') {
    FormatString<char[57]>
              (&msg,(char (*) [57])"Failed to unmap buffer. The data may have been corrupted");
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"Unmap",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/BufferGLImpl.cpp"
               ,0x187);
    std::__cxx11::string::~string((string *)&msg);
  }
  return;
}

Assistant:

void BufferGLImpl::Unmap(GLContextState& CtxState)
{
    constexpr bool ResetVAO = true;
    CtxState.BindBuffer(m_BindTarget, m_GlBuffer, ResetVAO);
    auto Result = glUnmapBuffer(m_BindTarget);
    // glUnmapBuffer() returns TRUE unless data values in the buffer's data store have
    // become corrupted during the period that the buffer was mapped. Such corruption
    // can be the result of a screen resolution change or other window system - dependent
    // event that causes system heaps such as those for high - performance graphics memory
    // to be discarded. GL implementations must guarantee that such corruption can
    // occur only during the periods that a buffer's data store is mapped. If such corruption
    // has occurred, glUnmapBuffer() returns FALSE, and the contents of the buffer's
    // data store become undefined.
    VERIFY(Result != GL_FALSE, "Failed to unmap buffer. The data may have been corrupted");
    (void)Result;
}